

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall
wasm::TranslateToFuzzReader::TranslateToFuzzReader
          (TranslateToFuzzReader *this,Module *wasm,string *filename,bool closedWorld)

{
  vector<char,_std::allocator<char>_> local_40;
  byte local_21;
  string *psStack_20;
  bool closedWorld_local;
  string *filename_local;
  Module *wasm_local;
  TranslateToFuzzReader *this_local;
  
  local_21 = closedWorld;
  psStack_20 = filename;
  filename_local = (string *)wasm;
  wasm_local = (Module *)this;
  ::wasm::read_file<std::vector<char,std::allocator<char>>>
            ((string *)&local_40,(BinaryOption)filename);
  TranslateToFuzzReader(this,wasm,&local_40,(bool)(local_21 & 1));
  std::vector<char,_std::allocator<char>_>::~vector(&local_40);
  return;
}

Assistant:

TranslateToFuzzReader::TranslateToFuzzReader(Module& wasm,
                                             std::string& filename,
                                             bool closedWorld)
  : TranslateToFuzzReader(wasm,
                          read_file<std::vector<char>>(filename, Flags::Binary),
                          closedWorld) {}